

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

void setupStateFeature(FeatureDescription *feature,string *name)

{
  RepeatedField<long> *this;
  uint uVar1;
  ulong uVar2;
  FeatureType *pFVar3;
  StateFeatureType *this_00;
  SequenceFeatureType *this_01;
  ArrayFeatureType *pAVar4;
  long *plVar5;
  undefined8 *puVar6;
  Arena *pAVar7;
  
  uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar6);
  pFVar3 = feature->type_;
  if (pFVar3 == (FeatureType *)0x0) {
    uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pFVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar7)
    ;
    feature->type_ = pFVar3;
  }
  if (pFVar3->_oneof_case_[0] == 8) {
    this_00 = (pFVar3->Type_).statetype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar3);
    pFVar3->_oneof_case_[0] = 8;
    uVar2 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                        (pAVar7);
    (pFVar3->Type_).statetype_ = this_00;
  }
  if (this_00->_oneof_case_[0] == 1) {
    pAVar4 = (this_00->Type_).arraytype_;
  }
  else {
    CoreML::Specification::StateFeatureType::clear_Type(this_00);
    this_00->_oneof_case_[0] = 1;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pAVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar7);
    (this_00->Type_).arraytype_ = pAVar4;
  }
  pAVar4->datatype_ = 0x10010;
  pFVar3 = feature->type_;
  if (pFVar3 == (FeatureType *)0x0) {
    uVar2 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pFVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(pAVar7)
    ;
    feature->type_ = pFVar3;
  }
  if (pFVar3->_oneof_case_[0] == 8) {
    this_01 = (pFVar3->Type_).sequencetype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar3);
    pFVar3->_oneof_case_[0] = 8;
    uVar2 = (pFVar3->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    this_01 = (SequenceFeatureType *)
              google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                        (pAVar7);
    (pFVar3->Type_).sequencetype_ = this_01;
  }
  if (*(uint32_t *)((long)&this_01->Type_ + 4) == 1) {
    pAVar4 = ((TypeUnion *)&this_01->sizerange_)->arraytype_;
  }
  else {
    CoreML::Specification::StateFeatureType::clear_Type((StateFeatureType *)this_01);
    *(uint32_t *)((long)&this_01->Type_ + 4) = 1;
    uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar7 = *(Arena **)pAVar7;
    }
    pAVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar7);
    ((TypeUnion *)&this_01->sizerange_)->arraytype_ = pAVar4;
  }
  this = &pAVar4->shape_;
  uVar1 = (pAVar4->shape_).current_size_;
  if (uVar1 == (pAVar4->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 1);
    plVar5 = google::protobuf::RepeatedField<long>::elements(this);
    plVar5[uVar1] = 1;
  }
  else {
    plVar5 = google::protobuf::RepeatedField<long>::elements(this);
    plVar5[uVar1] = 1;
  }
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

static void setupStateFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT16);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->add_shape(1);
}